

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutitem.cpp
# Opt level: O0

void __thiscall QWidgetItem::setGeometry(QWidgetItem *this,QRect *rect)

{
  bool bVar1;
  Int IVar2;
  Policy PVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int *piVar7;
  QRect *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int y;
  int x;
  Alignment alignHoriz;
  QSizePolicy sp;
  QSize pref;
  QSize s;
  QSize widgetRectSurplus;
  QRect r;
  undefined4 in_stack_fffffffffffffeb8;
  AlignmentFlag in_stack_fffffffffffffebc;
  QWidgetPrivate *in_stack_fffffffffffffec0;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_fffffffffffffec8;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  int local_e0;
  int local_dc;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_c8;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_c4;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_c0;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_bc;
  undefined4 local_b8;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_a0;
  int local_9c;
  int local_98;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_94;
  QSize local_90;
  undefined8 local_88;
  QSize local_80;
  QSize local_78;
  undefined8 local_70;
  QSize local_68;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_60;
  undefined1 *local_5c;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_54;
  undefined8 local_50;
  QSize local_48;
  QSize local_40;
  QSize local_38;
  QSize local_30;
  QSize local_28;
  QSize local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = (**(code **)(*in_RDI + 0x40))();
  if ((uVar6 & 1) == 0) {
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    bVar1 = QWidget::testAttribute
                      ((QWidget *)CONCAT44(in_stack_fffffffffffffecc.i,in_stack_fffffffffffffec8.i),
                       (WidgetAttribute)((ulong)in_stack_fffffffffffffec0 >> 0x20));
    if (bVar1) {
      local_18 = *(undefined1 (*) [16])in_RSI;
    }
    else {
      QWidget::d_func((QWidget *)0x3450c4);
      local_18 = (undefined1  [16])
                 fromLayoutItemRect(in_stack_fffffffffffffec0,
                                    (QRect *)CONCAT44(in_stack_fffffffffffffebc,
                                                      in_stack_fffffffffffffeb8));
    }
    local_20 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QRect::size((QRect *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    local_30 = QRect::size((QRect *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    local_20 = ::operator-((QSize *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                           (QSize *)CONCAT44(in_stack_fffffffffffffecc.i,in_stack_fffffffffffffec8.i
                                            ));
    local_38 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_40 = QRect::size((QRect *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    local_50 = (**(code **)(*in_RDI + 0x20))();
    local_48 = ::operator+((QSize *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                           (QSize *)CONCAT44(in_stack_fffffffffffffecc.i,in_stack_fffffffffffffec8.i
                                            ));
    local_38 = QSize::boundedTo((QSize *)CONCAT44(in_stack_fffffffffffffecc.i,
                                                  in_stack_fffffffffffffec8.i),
                                (QSize *)in_stack_fffffffffffffec0);
    local_dc = QRect::x((QRect *)0x3451d0);
    local_e0 = QRect::y((QRect *)0x3451e1);
    Qt::operator|((enum_type)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                  (enum_type)in_stack_fffffffffffffec0);
    local_54.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         QFlags<Qt::AlignmentFlag>::operator&
                   ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffffec0,
                    (QFlags<Qt::AlignmentFlag>)in_stack_fffffffffffffec8.i);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_54);
    if (IVar2 != 0) {
      local_5c = &DAT_aaaaaaaaaaaaaaaa;
      local_5c = (undefined1 *)(**(code **)(*in_RDI + 0x10))();
      local_60.data = 0xaaaaaaaa;
      local_60.bits = (Bits)QWidget::sizePolicy((QWidget *)in_stack_fffffffffffffec0);
      PVar3 = QSizePolicy::horizontalPolicy((QSizePolicy *)&local_60.bits);
      if (PVar3 == Ignored) {
        local_70 = (**(code **)(*(long *)in_RDI[2] + 0x70))();
        local_78 = QWidget::minimumSize
                             ((QWidget *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
        local_68 = QSize::expandedTo((QSize *)CONCAT44(in_stack_fffffffffffffecc.i,
                                                       in_stack_fffffffffffffec8.i),
                                     (QSize *)in_stack_fffffffffffffec0);
        QSize::width((QSize *)0x3452e6);
        QSize::setWidth((QSize *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
      }
      PVar3 = QSizePolicy::verticalPolicy((QSizePolicy *)&local_60.bits);
      if (PVar3 == Ignored) {
        local_88 = (**(code **)(*(long *)in_RDI[2] + 0x70))();
        local_90 = QWidget::minimumSize
                             ((QWidget *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
        local_80 = QSize::expandedTo((QSize *)CONCAT44(in_stack_fffffffffffffecc.i,
                                                       in_stack_fffffffffffffec8.i),
                                     (QSize *)in_stack_fffffffffffffec0);
        QSize::height((QSize *)0x345361);
        QSize::setHeight((QSize *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
      }
      QSize::operator+=((QSize *)in_stack_fffffffffffffec0,
                        (QSize *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      local_94.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)
           QFlags<Qt::AlignmentFlag>::operator&
                     ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffffec0,
                      in_stack_fffffffffffffebc);
      IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_94);
      if (IVar2 != 0) {
        local_98 = QSize::width((QSize *)0x3453be);
        local_9c = QSize::width((QSize *)0x3453d2);
        qMin<int>(&local_98,&local_9c);
        QSize::setWidth((QSize *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
      }
      local_a0.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)
           QFlags<Qt::AlignmentFlag>::operator&
                     ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffffec0,
                      in_stack_fffffffffffffebc);
      IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_a0);
      if (IVar2 != 0) {
        uVar6 = (**(code **)(*in_RDI + 0x48))();
        if ((uVar6 & 1) == 0) {
          local_ac = QSize::height((QSize *)0x3454d7);
          local_b0 = QSize::height((QSize *)0x3454eb);
          qMin<int>(&local_ac,&local_b0);
          QSize::setHeight((QSize *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        }
        else {
          local_a4 = QSize::height((QSize *)0x34544e);
          iVar4 = QSize::width((QSize *)0x345462);
          iVar5 = QSize::width((QSize *)0x345473);
          iVar4 = (**(code **)(*in_RDI + 0x50))(in_RDI,iVar4 - iVar5);
          local_a8 = QSize::height((QSize *)0x345495);
          local_a8 = iVar4 + local_a8;
          qMin<int>(&local_a4,&local_a8);
          QSize::setHeight((QSize *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        }
      }
    }
    local_b4.super_QFlagsStorage<Qt::AlignmentFlag>.i = (QFlagsStorage<Qt::AlignmentFlag>)0xaaaaaaaa
    ;
    QWidget::layoutDirection((QWidget *)0x345535);
    local_b8 = (undefined4)in_RDI[1];
    local_b4.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         QStyle::visualAlignment
                   ((LayoutDirection)in_stack_fffffffffffffec0,
                    (Alignment)in_stack_fffffffffffffecc.i);
    local_bc.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         QFlags<Qt::AlignmentFlag>::operator&
                   ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc
                   );
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_bc);
    if (IVar2 == 0) {
      local_c0.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)
           QFlags<Qt::AlignmentFlag>::operator&
                     ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffffec0,
                      in_stack_fffffffffffffebc);
      bVar1 = QFlags<Qt::AlignmentFlag>::operator!((QFlags<Qt::AlignmentFlag> *)&local_c0);
      if (bVar1) {
        iVar4 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8))
        ;
        iVar5 = QSize::width((QSize *)0x345610);
        local_dc = local_dc + (iVar4 - iVar5) / 2;
      }
    }
    else {
      iVar4 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      iVar5 = QSize::width((QSize *)0x3455aa);
      local_dc = local_dc + (iVar4 - iVar5);
    }
    local_c4.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         QFlags<Qt::AlignmentFlag>::operator&
                   ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc
                   );
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c4);
    if (IVar2 == 0) {
      local_c8.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)
           QFlags<Qt::AlignmentFlag>::operator&
                     ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffffec0,
                      in_stack_fffffffffffffebc);
      bVar1 = QFlags<Qt::AlignmentFlag>::operator!((QFlags<Qt::AlignmentFlag> *)&local_c8);
      if (bVar1) {
        iVar4 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                             );
        iVar5 = QSize::height((QSize *)0x3456e7);
        local_e0 = local_e0 + (iVar4 - iVar5) / 2;
      }
    }
    else {
      iVar4 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      iVar5 = QSize::height((QSize *)0x345680);
      local_e0 = local_e0 + (iVar4 - iVar5);
    }
    if (local_dc < 0) {
      in_stack_fffffffffffffedc = local_dc;
      piVar7 = QSize::rwidth((QSize *)0x345721);
      *piVar7 = in_stack_fffffffffffffedc + *piVar7;
      local_dc = 0;
    }
    if (local_e0 < 0) {
      in_stack_fffffffffffffed8 = local_e0;
      piVar7 = QSize::rheight((QSize *)0x34574d);
      *piVar7 = in_stack_fffffffffffffed8 + *piVar7;
      local_e0 = 0;
    }
    iVar4 = QSize::width((QSize *)0x345788);
    QSize::height((QSize *)0x345799);
    QWidget::setGeometry
              ((QWidget *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),iVar4,
               local_e0,local_dc,in_stack_fffffffffffffec8.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetItem::setGeometry(const QRect &rect)
{
    if (isEmpty())
        return;

    QRect r = !wid->testAttribute(Qt::WA_LayoutUsesWidgetRect)
            ? fromLayoutItemRect(wid->d_func(), rect)
            : rect;
    const QSize widgetRectSurplus = r.size() - rect.size();

    /*
       For historical reasons, this code is done using widget rect
       coordinates, not layout item rect coordinates. However,
       QWidgetItem's sizeHint(), maximumSize(), and heightForWidth()
       all work in terms of layout item rect coordinates, so we have to
       add or subtract widgetRectSurplus here and there. The code could
       be much simpler if we did everything using layout item rect
       coordinates and did the conversion right before the call to
       QWidget::setGeometry().
     */

    QSize s = r.size().boundedTo(maximumSize() + widgetRectSurplus);
    int x = r.x();
    int y = r.y();
    if (align & (Qt::AlignHorizontal_Mask | Qt::AlignVertical_Mask)) {
        QSize pref(sizeHint());
        QSizePolicy sp = wid->sizePolicy();
        if (sp.horizontalPolicy() == QSizePolicy::Ignored)
            pref.setWidth(wid->sizeHint().expandedTo(wid->minimumSize()).width());
        if (sp.verticalPolicy() == QSizePolicy::Ignored)
            pref.setHeight(wid->sizeHint().expandedTo(wid->minimumSize()).height());
        pref += widgetRectSurplus;
        if (align & Qt::AlignHorizontal_Mask)
            s.setWidth(qMin(s.width(), pref.width()));
        if (align & Qt::AlignVertical_Mask) {
            if (hasHeightForWidth())
                s.setHeight(qMin(s.height(),
                                 heightForWidth(s.width() - widgetRectSurplus.width())
                                 + widgetRectSurplus.height()));
            else
                s.setHeight(qMin(s.height(), pref.height()));
        }
    }
    Qt::Alignment alignHoriz = QStyle::visualAlignment(wid->layoutDirection(), align);
    if (alignHoriz & Qt::AlignRight)
        x = x + (r.width() - s.width());
    else if (!(alignHoriz & Qt::AlignLeft))
        x = x + (r.width() - s.width()) / 2;

    if (align & Qt::AlignBottom)
        y = y + (r.height() - s.height());
    else if (!(align & Qt::AlignTop))
        y = y + (r.height() - s.height()) / 2;

    // Make sure we don't move outside of the parent, e.g when styles demand
    // surplus space that exceeds the available margins (f.ex macOS with QGroupBox)
    if (x < 0) {
        s.rwidth() += x;
        x = 0;
    }
    if (y < 0) {
        s.rheight() += y;
        y = 0;
    }

    wid->setGeometry(x, y, s.width(), s.height());
}